

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O1

MPP_RET mpp_check_support_format(MppCtxType type,MppCodingType coding)

{
  MPP_RET MVar1;
  long lVar2;
  bool bVar3;
  
  MVar1 = MPP_NOK;
  lVar2 = 4;
  do {
    if ((*(MppCtxType *)((long)Mpp::set_io_mode::iomode_2str + lVar2 + 0xc) == type) &&
       (*(MppCodingType *)((long)&support_list[0].type + lVar2) == coding)) {
      bVar3 = true;
      MVar1 = MPP_OK;
    }
    else {
      bVar3 = false;
    }
  } while ((!bVar3) && (bVar3 = lVar2 != 0x16c, lVar2 = lVar2 + 0x18, bVar3));
  return MVar1;
}

Assistant:

MPP_RET mpp_check_support_format(MppCtxType type, MppCodingType coding)
{
    MPP_RET ret = MPP_NOK;
    RK_U32 i = 0;

    for (i = 0; i < MPP_ARRAY_ELEMS(support_list); i++) {
        MppCodingTypeInfo *info = &support_list[i];
        if (type    == info->type &&
            coding  == info->coding) {
            ret = MPP_OK;
            break;
        }
    }
    return ret;
}